

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

bool __thiscall
QTemporaryFileEngine::materializeUnnamedFile
          (QTemporaryFileEngine *this,QString *newName,MaterializationMode mode)

{
  QFSFileEnginePrivate *dst_00;
  int *piVar1;
  int in_EDX;
  QFSFileEngine *in_RDI;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *d;
  anon_class_32_2_9f8265eb materializeAsTemplate;
  anon_class_8_1_8991fb9c_for_success success;
  anon_class_24_1_ba1d7944_for_materializeAt materializeAt;
  QByteArray src;
  QFileSystemEntry dst;
  QFileSystemEntry *in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb2;
  undefined1 in_stack_fffffffffffffeb3;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  FileError error;
  QAbstractFileEngine *this_00;
  int in_stack_fffffffffffffec8;
  int iVar2;
  int in_stack_fffffffffffffecc;
  uint in_stack_fffffffffffffee0;
  byte local_101;
  QSystemError local_100 [4];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  QFSFileEngine *local_c8;
  QFSFileEngine *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  QAbstractFileEngine local_a0 [3];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dst_00 = d_func((QTemporaryFileEngine *)0x2f8679);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = local_a0;
  QByteArray::number(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  ::operator+((char (*) [15])in_RDI,
              (QByteArray *)
              CONCAT17(in_stack_fffffffffffffeb7,
                       CONCAT16(in_stack_fffffffffffffeb6,
                                CONCAT15(in_stack_fffffffffffffeb5,
                                         CONCAT14(in_stack_fffffffffffffeb4,
                                                  CONCAT13(in_stack_fffffffffffffeb3,
                                                           CONCAT12(in_stack_fffffffffffffeb2,
                                                                    in_stack_fffffffffffffeb0)))))))
  ;
  ::QStringBuilder::operator_cast_to_QByteArray
            ((QStringBuilder<const_char_(&)[15],_QByteArray> *)in_stack_fffffffffffffea8);
  QStringBuilder<const_char_(&)[15],_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[15],_QByteArray> *)0x2f8700);
  QByteArray::~QByteArray((QByteArray *)0x2f870d);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            ((QByteArray *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,
                               CONCAT15(in_stack_fffffffffffffeb5,
                                        CONCAT14(in_stack_fffffffffffffeb4,
                                                 CONCAT13(in_stack_fffffffffffffeb3,
                                                          CONCAT12(in_stack_fffffffffffffeb2,
                                                                   in_stack_fffffffffffffeb0)))))),
             (QByteArray *)in_stack_fffffffffffffea8);
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = (QFSFileEngine *)&DAT_aaaaaaaaaaaaaaaa;
  local_c0 = in_RDI;
  materializeUnnamedFile(QString_const&,QTemporaryFileEngine::MaterializationMode)::$_0::__0
            ((anon_class_24_1_ba1d7944_for_materializeAt *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,
                               CONCAT15(in_stack_fffffffffffffeb5,
                                        CONCAT14(in_stack_fffffffffffffeb4,
                                                 CONCAT13(in_stack_fffffffffffffeb3,
                                                          CONCAT12(in_stack_fffffffffffffeb2,
                                                                   in_stack_fffffffffffffeb0)))))),
             (anon_class_24_1_ba1d7944_for_materializeAt *)in_stack_fffffffffffffea8);
  local_c8 = local_c0;
  if (in_EDX == 2) {
    in_stack_fffffffffffffeb7 =
         materializeUnnamedFile::anon_class_32_2_9f8265eb::operator()
                   ((anon_class_32_2_9f8265eb *)CONCAT44(2,in_stack_fffffffffffffee0),
                    (QString *)dst_00);
    error = (FileError)((ulong)in_RDI >> 0x20);
    if ((bool)in_stack_fffffffffffffeb7) {
      local_101 = 1;
      goto LAB_002f8a32;
    }
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry
              ((QFileSystemEntry *)
               CONCAT17(in_stack_fffffffffffffeb7,
                        CONCAT16(in_stack_fffffffffffffeb6,
                                 CONCAT15(in_stack_fffffffffffffeb5,
                                          CONCAT14(in_stack_fffffffffffffeb4,
                                                   CONCAT13(in_stack_fffffffffffffeb3,
                                                            CONCAT12(in_stack_fffffffffffffeb2,
                                                                     in_stack_fffffffffffffeb0))))))
               ,&in_stack_fffffffffffffea8->m_filePath);
    in_stack_fffffffffffffeb6 =
         materializeUnnamedFile::anon_class_32_2_9f8265eb::
         anon_class_24_1_ba1d7944_for_materializeAt::operator()
                   ((anon_class_24_1_ba1d7944_for_materializeAt *)
                    CONCAT44(in_EDX,in_stack_fffffffffffffee0),(QFileSystemEntry *)dst_00);
    if ((bool)in_stack_fffffffffffffeb6) {
      in_stack_fffffffffffffeb5 =
           materializeUnnamedFile::anon_class_32_2_9f8265eb::anon_class_8_1_8991fb9c_for_success::
           operator()((anon_class_8_1_8991fb9c_for_success *)
                      CONCAT17(in_stack_fffffffffffffeb7,
                               CONCAT16(in_stack_fffffffffffffeb6,
                                        CONCAT15(in_stack_fffffffffffffeb5,
                                                 CONCAT14(in_stack_fffffffffffffeb4,
                                                          CONCAT13(in_stack_fffffffffffffeb3,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffeb2,
                                                  in_stack_fffffffffffffeb0)))))),
                      in_stack_fffffffffffffea8);
      iVar2 = 1;
      local_101 = in_stack_fffffffffffffeb5;
    }
    else {
      piVar1 = __errno_location();
      if ((*piVar1 == 0x11) && (in_EDX == 0)) {
        iVar2 = (int)*(undefined8 *)(in_RDI + 1);
        in_stack_fffffffffffffeb4 =
             materializeUnnamedFile::anon_class_32_2_9f8265eb::operator()
                       ((anon_class_32_2_9f8265eb *)(ulong)in_stack_fffffffffffffee0,
                        (QString *)dst_00);
        if ((bool)in_stack_fffffffffffffeb4) {
          QFSFileEngine::close(in_RDI,iVar2);
          in_stack_fffffffffffffeb3 =
               QFSFileEngine::renameOverwrite
                         ((QFSFileEngine *)
                          CONCAT17(in_stack_fffffffffffffeb7,
                                   CONCAT16(in_stack_fffffffffffffeb6,
                                            CONCAT15(in_stack_fffffffffffffeb5,
                                                     CONCAT14(in_stack_fffffffffffffeb4,
                                                              CONCAT13(in_stack_fffffffffffffeb3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeb2,
                                                  in_stack_fffffffffffffeb0)))))),
                          &in_stack_fffffffffffffea8->m_filePath);
          iVar2 = 1;
          local_101 = in_stack_fffffffffffffeb3;
        }
        else {
          local_101 = 0;
          iVar2 = 1;
        }
      }
      else {
        iVar2 = 0;
      }
    }
    error = (FileError)((ulong)in_RDI >> 0x20);
    QFileSystemEntry::~QFileSystemEntry
              ((QFileSystemEntry *)
               CONCAT17(in_stack_fffffffffffffeb7,
                        CONCAT16(in_stack_fffffffffffffeb6,
                                 CONCAT15(in_stack_fffffffffffffeb5,
                                          CONCAT14(in_stack_fffffffffffffeb4,
                                                   CONCAT13(in_stack_fffffffffffffeb3,
                                                            CONCAT12(in_stack_fffffffffffffeb2,
                                                                     in_stack_fffffffffffffeb0))))))
              );
    if (iVar2 != 0) goto LAB_002f8a32;
  }
  piVar1 = __errno_location();
  QSystemError::QSystemError(local_100,*piVar1,NativeError);
  QSystemError::toString((QSystemError *)in_stack_fffffffffffffea8);
  QAbstractFileEngine::setError
            (this_00,error,
             (QString *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,
                               CONCAT15(in_stack_fffffffffffffeb5,
                                        CONCAT14(in_stack_fffffffffffffeb4,
                                                 CONCAT13(in_stack_fffffffffffffeb3,
                                                          CONCAT12(in_stack_fffffffffffffeb2,
                                                                   in_stack_fffffffffffffeb0)))))));
  QString::~QString((QString *)0x2f8a05);
  local_101 = 0;
LAB_002f8a32:
  materializeUnnamedFile(QString_const&,QTemporaryFileEngine::MaterializationMode)::$_1::~__1
            ((anon_class_32_2_9f8265eb *)0x2f8a3c);
  materializeUnnamedFile(QString_const&,QTemporaryFileEngine::MaterializationMode)::$_0::~__0
            ((anon_class_24_1_ba1d7944_for_materializeAt *)0x2f8a49);
  QByteArray::~QByteArray((QByteArray *)0x2f8a56);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_101 & 1);
}

Assistant:

bool QTemporaryFileEngine::materializeUnnamedFile(const QString &newName, QTemporaryFileEngine::MaterializationMode mode)
{
    Q_ASSERT(isUnnamedFile());

#ifdef LINUX_UNNAMED_TMPFILE
    Q_D(QFSFileEngine);
    const QByteArray src = "/proc/self/fd/" + QByteArray::number(d->fd);
    auto materializeAt = [=](const QFileSystemEntry &dst) {
        return ::linkat(AT_FDCWD, src, AT_FDCWD, dst.nativeFilePath(), AT_SYMLINK_FOLLOW) == 0;
    };
#else
    auto materializeAt = [](const QFileSystemEntry &) { return false; };
#endif

    auto success = [this](const QFileSystemEntry &entry) {
        filePathIsTemplate = false;
        unnamedFile = false;
        d_func()->fileEntry = entry;
        return true;
    };

    auto materializeAsTemplate = [=](const QString &newName) {
        QTemporaryFileName tfn(newName);
        static const int maxAttempts = 16;
        for (int attempt = 0; attempt < maxAttempts; ++attempt) {
            tfn.generateNext();
            QFileSystemEntry entry(tfn.path, QFileSystemEntry::FromNativePath());
            if (materializeAt(entry))
                return success(entry);
        }
        return false;
    };

    if (mode == NameIsTemplate) {
        if (materializeAsTemplate(newName))
            return true;
    } else {
        // Use linkat to materialize the file
        QFileSystemEntry dst(newName);
        if (materializeAt(dst))
            return success(dst);

        if (errno == EEXIST && mode == Overwrite) {
            // retry by first creating a temporary file in the right dir
            if (!materializeAsTemplate(templateName))
                return false;

            // then rename the materialized file to target (same as renameOverwrite)
            QFSFileEngine::close();
            return QFSFileEngine::renameOverwrite(newName);
        }
    }

    // failed
    setError(QFile::RenameError, QSystemError(errno, QSystemError::NativeError).toString());
    return false;
}